

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_export.cpp
# Opt level: O3

void __thiscall
duckdb::LogicalExport::LogicalExport
          (LogicalExport *this,ClientContext *context,
          unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true> *copy_info_p,
          unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true>
          *exported_tables_p)

{
  _Head_base<0UL,_duckdb::CopyInfo_*,_false> _Var1;
  _Head_base<0UL,_duckdb::BoundExportData_*,_false> _Var2;
  type info;
  LogicalExport *this_00;
  pointer *__ptr;
  
  this_00 = (LogicalExport *)0xb1;
  LogicalOperator::LogicalOperator(&this->super_LogicalOperator,LOGICAL_EXPORT);
  (this->super_LogicalOperator)._vptr_LogicalOperator = (_func_int **)&PTR__LogicalExport_019779d0;
  _Var1._M_head_impl =
       (CopyInfo *)
       (copy_info_p->super_unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>).
       _M_t.super___uniq_ptr_impl<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::ParseInfo_*,_std::default_delete<duckdb::ParseInfo>_>.
       super__Head_base<0UL,_duckdb::ParseInfo_*,_false>._M_head_impl;
  (copy_info_p->super_unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>)._M_t.
  super___uniq_ptr_impl<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::ParseInfo_*,_std::default_delete<duckdb::ParseInfo>_>.
  super__Head_base<0UL,_duckdb::ParseInfo_*,_false>._M_head_impl = (ParseInfo *)0x0;
  (this->copy_info).super_unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>._M_t.
  super___uniq_ptr_impl<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::CopyInfo_*,_std::default_delete<duckdb::CopyInfo>_>.
  super__Head_base<0UL,_duckdb::CopyInfo_*,_false>._M_head_impl = _Var1._M_head_impl;
  info = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator*
                   (&this->copy_info);
  GetCopyFunction(&this->function,this_00,context,info);
  _Var2._M_head_impl =
       (BoundExportData *)
       (exported_tables_p->
       super_unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>)._M_t.
       super___uniq_ptr_impl<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::ParseInfo_*,_std::default_delete<duckdb::ParseInfo>_>.
       super__Head_base<0UL,_duckdb::ParseInfo_*,_false>._M_head_impl;
  (exported_tables_p->super_unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>).
  _M_t.super___uniq_ptr_impl<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::ParseInfo_*,_std::default_delete<duckdb::ParseInfo>_>.
  super__Head_base<0UL,_duckdb::ParseInfo_*,_false>._M_head_impl = (ParseInfo *)0x0;
  (this->exported_tables).
  super_unique_ptr<duckdb::BoundExportData,_std::default_delete<duckdb::BoundExportData>_>._M_t.
  super___uniq_ptr_impl<duckdb::BoundExportData,_std::default_delete<duckdb::BoundExportData>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::BoundExportData_*,_std::default_delete<duckdb::BoundExportData>_>.
  super__Head_base<0UL,_duckdb::BoundExportData_*,_false>._M_head_impl = _Var2._M_head_impl;
  return;
}

Assistant:

LogicalExport::LogicalExport(ClientContext &context, unique_ptr<ParseInfo> copy_info_p,
                             unique_ptr<ParseInfo> exported_tables_p)
    : LogicalOperator(LogicalOperatorType::LOGICAL_EXPORT),
      copy_info(unique_ptr_cast<ParseInfo, CopyInfo>(std::move(copy_info_p))),
      function(GetCopyFunction(context, *copy_info)),
      exported_tables(unique_ptr_cast<ParseInfo, BoundExportData>(std::move(exported_tables_p))) {
}